

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::find_line_end
          (Fl_Text_Display *this,int startPos,bool startPosIsLineStart,int *lineEnd,
          int *nextLineStart)

{
  int iVar1;
  int iVar2;
  Fl_Text_Buffer *pFVar3;
  Fl_Text_Buffer *this_00;
  int ls;
  int le;
  int retLineStart;
  int retLines;
  int *nextLineStart_local;
  int *lineEnd_local;
  bool startPosIsLineStart_local;
  Fl_Text_Display *pFStack_18;
  int startPos_local;
  Fl_Text_Display *this_local;
  
  _retLineStart = nextLineStart;
  nextLineStart_local = lineEnd;
  lineEnd_local._3_1_ = startPosIsLineStart;
  lineEnd_local._4_4_ = startPos;
  pFStack_18 = this;
  if (this->mContinuousWrap == 0) {
    pFVar3 = buffer(this);
    iVar1 = Fl_Text_Buffer::line_end(pFVar3,lineEnd_local._4_4_);
    pFVar3 = buffer(this);
    iVar2 = Fl_Text_Buffer::next_char(pFVar3,iVar1);
    *nextLineStart_local = iVar1;
    pFVar3 = buffer(this);
    iVar1 = Fl_Text_Buffer::length(pFVar3);
    iVar1 = min(iVar1,iVar2);
    *_retLineStart = iVar1;
  }
  else {
    pFVar3 = buffer(this);
    iVar1 = lineEnd_local._4_4_;
    this_00 = buffer(this);
    iVar2 = Fl_Text_Buffer::length(this_00);
    wrapped_line_counter
              (this,pFVar3,iVar1,iVar2,1,(bool)(lineEnd_local._3_1_ & 1),0,_retLineStart,&le,&ls,
               nextLineStart_local,true);
  }
  return;
}

Assistant:

void Fl_Text_Display::find_line_end(int startPos, bool startPosIsLineStart,
                                    int *lineEnd, int *nextLineStart) const {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  int retLines, retLineStart;

  /* if we're not wrapping use more efficient BufEndOfLine */
  if (!mContinuousWrap) {
    int le = buffer()->line_end(startPos);
    int ls = buffer()->next_char(le);
    *lineEnd = le;
    *nextLineStart = min(buffer()->length(), ls);
    return;
  }

  /* use the wrapped line counter routine to count forward one line */
  wrapped_line_counter(buffer(), startPos, buffer()->length(),
                       1, startPosIsLineStart, 0, nextLineStart, &retLines,
                       &retLineStart, lineEnd);
}